

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O2

void * tommy_tree_search(tommy_tree *tree,void *data)

{
  long lVar1;
  tommy_tree_node *ptVar2;
  void *pvVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = tommy_tree_search_node(tree->cmp,tree->root,data);
  if (ptVar2 == (tommy_tree_node *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = ptVar2->data;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pvVar3;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_tree_search(tommy_tree* tree, void* data)
{
	tommy_tree_node* node = tommy_tree_search_node(tree->cmp, tree->root, data);

	if (!node)
		return 0;

	return node->data;
}